

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void vli_modMult_n(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  uECC_word_t uVar1;
  uECC_word_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uECC_word_t local_108;
  uECC_word_t product [8];
  uECC_word_t tmp [8];
  uECC_word_t modMultiple [8];
  uECC_word_t *v [2];
  
  modMultiple[7] = (uECC_word_t)(product + 7);
  vli_mult(&local_108,left,right);
  vli_set(modMultiple + 3,curve_n);
  vli_clear(tmp + 7);
  uVar4 = 1;
  for (iVar8 = 0; iVar8 != 0x101; iVar8 = iVar8 + 1) {
    uVar1 = modMultiple[(uVar4 ^ 1) + 7];
    uVar2 = modMultiple[uVar4 + 7];
    uVar5 = 0;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      uVar3 = *(ulong *)(uVar2 + lVar6 * 8);
      uVar7 = tmp[lVar6 + 7] + uVar5;
      if (uVar7 != 0) {
        uVar5 = (ulong)(uVar3 < uVar7);
      }
      *(ulong *)(uVar1 + lVar6 * 8) = uVar3 - uVar7;
    }
    uVar4 = (ulong)(uVar4 == uVar5);
    vli_rshift1(tmp + 7);
    modMultiple[2] = modMultiple[2] | modMultiple[3] << 0x3f;
    vli_rshift1(modMultiple + 3);
  }
  vli_set(result,(uECC_word_t *)modMultiple[uVar4 + 7]);
  return;
}

Assistant:

static void vli_modMult_n(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t product[2 * uECC_WORDS];
    uECC_word_t modMultiple[2 * uECC_WORDS];
    uECC_word_t tmp[2 * uECC_WORDS];
    uECC_word_t *v[2] = {tmp, product};
    bitcount_t i;
    uECC_word_t index = 1;

    vli_mult(product, left, right);
    vli_set(modMultiple + uECC_WORDS, curve_n); /* works if curve_n has its highest bit set */
    vli_clear(modMultiple);

    for (i = 0; i <= uECC_BYTES * 8; ++i) {
        uECC_word_t borrow = vli2_sub(v[1 - index], v[index], modMultiple);
        index = !(index ^ borrow); /* Swap the index if there was no borrow */
        vli2_rshift1(modMultiple);
    }
    vli_set(result, v[index]);
}